

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

int __thiscall
FOptionMenuItemControl::Draw
          (FOptionMenuItemControl *this,FOptionMenuDescriptor *desc,int y,int indent,bool selected)

{
  long lVar1;
  long lVar2;
  undefined7 in_register_00000081;
  int Key2;
  int Key1;
  char description [64];
  
  lVar2 = 4;
  if ((int)CONCAT71(in_register_00000081,selected) != 0) {
    lVar2 = 0x18;
  }
  lVar1 = 0x14;
  if (this->mWaiting == false) {
    lVar1 = lVar2;
  }
  FOptionMenuItem::drawLabel
            (&this->super_FOptionMenuItem,indent,y,
             *(EColorRange *)((long)&OptionSettings.mTitleColor + lVar1),false);
  FKeyBindings::GetKeysForCommand
            (this->mBindings,
             FName::NameData.NameArray
             [(this->super_FOptionMenuItem).super_FListMenuItem.mAction.Index].Text,&Key1,&Key2);
  C_NameKeys(description,Key1,Key2);
  if (description[0] == '\0') {
    DCanvas::DrawText((DCanvas *)screen,SmallFont,0xc,CleanXfac_1 * 0xe + indent,
                      (OptionSettings.mLinespacing + -8) * CleanYfac_1 + y,"---",0x40001394,1,0);
  }
  else {
    M_DrawConText(9,CleanXfac_1 * 0xe + indent,(OptionSettings.mLinespacing + -8) * CleanYfac_1 + y,
                  description);
  }
  return indent;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		drawLabel(indent, y, mWaiting? OptionSettings.mFontColorHighlight: 
			(selected? OptionSettings.mFontColorSelection : OptionSettings.mFontColor));

		char description[64];
		int Key1, Key2;

		mBindings->GetKeysForCommand(mAction, &Key1, &Key2);
		C_NameKeys (description, Key1, Key2);
		if (description[0])
		{
			M_DrawConText(CR_WHITE, indent + CURSORSPACE, y + (OptionSettings.mLinespacing-8)*CleanYfac_1, description);
		}
		else
		{
			screen->DrawText(SmallFont, CR_BLACK, indent + CURSORSPACE, y + (OptionSettings.mLinespacing-8)*CleanYfac_1, "---",
				DTA_CleanNoMove_1, true, TAG_DONE);
		}
		return indent;
	}